

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O1

void __thiscall wasm::ThreadPool::notifyThreadIsReady(ThreadPool *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)threadMutex);
  if (iVar1 == 0) {
    LOCK();
    (this->ready).super___atomic_base<unsigned_long>._M_i =
         (this->ready).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)threadMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ThreadPool::notifyThreadIsReady() {
  DEBUG_POOL("notify thread is ready\n";)
  std::lock_guard<std::mutex> lock(threadMutex);
  ready.fetch_add(1);
  condition.notify_one();
}